

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::bootstrap::Bootstrap::bind_function(Bootstrap *this,Function_Params *params)

{
  int iVar1;
  Boxed_Value *pBVar2;
  Boxed_Value *pBVar3;
  arity_error *this_00;
  range_error *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Boxed_Value BVar5;
  Const_Proxy_Function f;
  allocator_type local_72;
  undefined1 local_71;
  Bound_Function *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_68;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_60;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_50;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_40;
  
  if (params->m_begin == params->m_end) {
    this_00 = (arity_error *)__cxa_allocate_exception(0x18);
    exception::arity_error::arity_error(this_00,0,1);
    __cxa_throw(this_00,&exception::arity_error::typeinfo,std::range_error::~range_error);
  }
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
            ((chaiscript *)&local_60,params->m_begin,(Type_Conversions_State *)0x0);
  if (((long)(local_60.
              super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->m_arity != -1) &&
     (((long)params->m_end - (long)params->m_begin >> 4) + -1 !=
      (long)(local_60.
             super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->m_arity)) {
    this_01 = (range_error *)__cxa_allocate_exception(0x18);
    pBVar2 = params->m_begin;
    pBVar3 = params->m_end;
    iVar1 = (local_60.
             super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->m_arity;
    std::range_error::range_error(this_01,"Function dispatch arity mismatch");
    *(undefined ***)this_01 = &PTR__range_error_005a4cd8;
    *(int *)(this_01 + 0x10) = (int)((ulong)((long)pBVar3 - (long)pBVar2) >> 4);
    *(int *)(this_01 + 0x14) = iVar1;
    __cxa_throw(this_01,&exception::arity_error::typeinfo,std::range_error::~range_error);
  }
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  vector<chaiscript::Boxed_Value_const*,void>
            ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)&local_40,
             params->m_begin + 1,params->m_end,&local_72);
  local_70 = (Bound_Function *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Bound_Function,std::allocator<chaiscript::dispatch::Bound_Function>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (&_Stack_68,&local_70,(allocator<chaiscript::dispatch::Bound_Function> *)&local_71,
             &local_60,&local_40);
  local_50.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &local_70->super_Proxy_Function_Base;
  local_50.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_68._M_pi;
  local_70 = (Bound_Function *)0x0;
  _Stack_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base_const>
            ((Object_Data *)this,&local_50,false);
  if (local_50.
      super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_68._M_pi);
  }
  Catch::clara::std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
  ~vector(&local_40);
  _Var4._M_pi = extraout_RDX;
  if (local_60.
      super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_00;
  }
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value bind_function(const Function_Params &params) {
      if (params.empty()) {
        throw exception::arity_error(0, 1);
      }

      Const_Proxy_Function f = boxed_cast<Const_Proxy_Function>(params[0]);

      if (f->get_arity() != -1 && size_t(f->get_arity()) != params.size() - 1) {
        throw exception::arity_error(static_cast<int>(params.size()), f->get_arity());
      }

      return Boxed_Value(Const_Proxy_Function(
          std::make_shared<dispatch::Bound_Function>(std::move(f), std::vector<Boxed_Value>(params.begin() + 1, params.end()))));
    }